

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86inst.cpp
# Opt level: O3

uint32_t asmjit::X86Inst::getIdByName(char *name,size_t len)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  undefined1 *puVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  
  if (name != (char *)0x0) {
    if (len == 0xffffffffffffffff) {
      len = strlen(name);
    }
    if ((0xffffffffffffffef < len - 0x11) && (uVar2 = (int)*name - 0x61, uVar2 < 0x1a)) {
      uVar3 = (ulong)*(ushort *)(X86InstNameAZ + (ulong)uVar2 * 4);
      if ((uVar3 != 0) && (*(ushort *)(X86InstNameAZ + (ulong)uVar2 * 4 + 2) - uVar3 != 0)) {
        puVar5 = X86InstDB::instData + uVar3 * 0xc;
        uVar3 = *(ushort *)(X86InstNameAZ + (ulong)uVar2 * 4 + 2) - uVar3;
        do {
          uVar6 = uVar3 >> 1;
          sVar9 = 0;
          lVar7 = uVar6 * 0xc;
          uVar8 = (ulong)(*(uint *)(puVar5 + lVar7) >> 8 & 0x3fff);
          do {
            iVar4 = (uint)(byte)(&X86InstDB::nameData)[uVar8 + sVar9] - (uint)(byte)name[sVar9];
            if (iVar4 != 0) goto LAB_0010d654;
            sVar9 = sVar9 + 1;
          } while (len != sVar9);
          iVar4 = (int)(char)(&X86InstDB::nameData)[uVar8 + len];
LAB_0010d654:
          if (iVar4 < 0) {
            uVar3 = uVar3 - 1;
            puVar5 = puVar5 + lVar7 + 0xc;
            uVar6 = uVar3 >> 1;
          }
          else if (iVar4 == 0) {
            return (uint32_t)((long)(puVar5 + lVar7 + -0x16d280) / 0xc);
          }
          bVar1 = 1 < uVar3;
          uVar3 = uVar6;
        } while (bVar1);
      }
    }
  }
  return 0;
}

Assistant:

uint32_t X86Inst::getIdByName(const char* name, size_t len) noexcept {
  if (ASMJIT_UNLIKELY(!name))
    return Inst::kIdNone;

  if (len == Globals::kInvalidIndex)
    len = ::strlen(name);

  if (ASMJIT_UNLIKELY(len == 0 || len > kX86InstMaxLength))
    return Inst::kIdNone;

  uint32_t prefix = static_cast<uint32_t>(name[0]) - 'a';
  if (ASMJIT_UNLIKELY(prefix > 'z' - 'a'))
    return Inst::kIdNone;

  uint32_t index = X86InstNameAZ[prefix].start;
  if (ASMJIT_UNLIKELY(!index))
    return Inst::kIdNone;

  const char* nameData = X86InstDB::nameData;
  const X86Inst* instData = X86InstDB::instData;

  const X86Inst* base = instData + index;
  const X86Inst* end  = instData + X86InstNameAZ[prefix].end;

  for (size_t lim = (size_t)(end - base); lim != 0; lim >>= 1) {
    const X86Inst* cur = base + (lim >> 1);
    int result = Utils::cmpInstName(nameData + cur[0].getNameDataIndex(), name, len);

    if (result < 0) {
      base = cur + 1;
      lim--;
      continue;
    }

    if (result > 0)
      continue;

    return static_cast<uint32_t>((size_t)(cur - instData));
  }

  return Inst::kIdNone;
}